

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

format_error * __thiscall
boost::runtime::specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
operator<<(format_error *__return_storage_ptr__,
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *this,
          char *val)

{
  std::__cxx11::string::append((char *)&(this->super_input_error).super_param_error.msg);
  format_error::format_error(__return_storage_ptr__,(format_error *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }